

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O1

void __thiscall icu_63::SortKeyByteSink::Append(SortKeyByteSink *this,char *bytes,int32_t n)

{
  uint uVar1;
  ulong uVar2;
  ulong __n;
  int iVar3;
  int32_t iVar4;
  
  __n = (ulong)(uint)n;
  if (bytes != (char *)0x0 && 0 < n) {
    uVar1 = this->ignore_;
    if (0 < (int)uVar1) {
      iVar3 = uVar1 - n;
      iVar4 = 0;
      if (0 < iVar3) {
        iVar4 = iVar3;
      }
      uVar2 = (ulong)(uint)-iVar3;
      if (-1 < iVar3) {
        uVar2 = __n;
      }
      this->ignore_ = iVar4;
      if (-1 < iVar3) {
        return;
      }
      bytes = bytes + (iVar3 >> 0x1f & uVar1);
      __n = uVar2;
    }
    iVar3 = this->appended_;
    this->appended_ = iVar3 + (int)__n;
    if (this->buffer_ + iVar3 != bytes) {
      if (this->capacity_ - iVar3 < (int)__n) {
        (*(this->super_ByteSink)._vptr_ByteSink[5])();
        return;
      }
      memcpy(this->buffer_ + iVar3,bytes,__n);
      return;
    }
  }
  return;
}

Assistant:

void
SortKeyByteSink::Append(const char *bytes, int32_t n) {
    if (n <= 0 || bytes == NULL) {
        return;
    }
    if (ignore_ > 0) {
        int32_t ignoreRest = ignore_ - n;
        if (ignoreRest >= 0) {
            ignore_ = ignoreRest;
            return;
        } else {
            bytes += ignore_;
            n = -ignoreRest;
            ignore_ = 0;
        }
    }
    int32_t length = appended_;
    appended_ += n;
    if ((buffer_ + length) == bytes) {
        return;  // the caller used GetAppendBuffer() and wrote the bytes already
    }
    int32_t available = capacity_ - length;
    if (n <= available) {
        uprv_memcpy(buffer_ + length, bytes, n);
    } else {
        AppendBeyondCapacity(bytes, n, length);
    }
}